

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  uint uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  ulong uVar4;
  long lVar5;
  uchar *puVar6;
  ulong __n;
  uchar *puVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 in_ZMM7 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> positionX;
  allocator_type local_89;
  uchar *local_88;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  ImageTemplate<unsigned_char> local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_88 = (uchar *)CONCAT44(in_register_00000014,startYIn);
  local_80 = widthIn;
  local_7c = startXIn;
  local_74 = heightIn;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,widthIn,heightIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,widthOut,heightOut);
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  local_70._data = (uchar *)0x0;
  local_70._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_70,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_70);
  local_70._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_0011ac30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_70);
  local_78 = in->_rowSize;
  uVar1 = out->_rowSize;
  local_88 = in->_data + (int)local_88 * local_78;
  puVar6 = out->_data;
  __n = (ulong)widthOut;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__n,&local_89);
  if (widthOut != 0) {
    auVar8 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar9 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar10 = vpmovsxbd_avx512f(_DAT_00111d34);
    auVar11 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar12 = vpbroadcastd_avx512f(ZEXT416(0x10));
    lVar5 = 0;
    auVar13 = vpbroadcastq_avx512f();
    auVar14 = vpbroadcastd_avx512f();
    do {
      auVar15 = vpmulld_avx512f(auVar10,auVar14);
      uVar4 = vpcmpuq_avx512f(auVar9,auVar13,2);
      if ((uVar4 & 1) != 0) {
        in_ZMM7 = ZEXT464(auVar15._0_4_ / widthOut);
      }
      if ((uVar4 & 2) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._4_4_ / widthOut,1);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      if ((uVar4 & 4) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._8_4_ / widthOut,2);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      if ((uVar4 & 8) != 0) {
        auVar2 = vpinsrd_avx(in_ZMM7._0_16_,auVar15._12_4_ / widthOut,3);
        in_ZMM7 = vinserti32x4_avx512f(in_ZMM7,auVar2,0);
      }
      auVar18 = in_ZMM7;
      if ((uVar4 & 0x10) != 0) {
        auVar16 = vpbroadcastd_avx512f();
        auVar18._0_16_ = in_ZMM7._0_16_;
        auVar18._16_4_ = auVar16._16_4_;
        auVar18._20_4_ = in_ZMM7._20_4_;
        auVar18._24_4_ = in_ZMM7._24_4_;
        auVar18._28_4_ = in_ZMM7._28_4_;
        auVar18._32_4_ = in_ZMM7._32_4_;
        auVar18._36_4_ = in_ZMM7._36_4_;
        auVar18._40_4_ = in_ZMM7._40_4_;
        auVar18._44_4_ = in_ZMM7._44_4_;
        auVar18._48_4_ = in_ZMM7._48_4_;
        auVar18._52_4_ = in_ZMM7._52_4_;
        auVar18._56_4_ = in_ZMM7._56_4_;
        auVar18._60_4_ = in_ZMM7._60_4_;
      }
      auVar16 = auVar18;
      if ((uVar4 & 0x20) != 0) {
        auVar17 = vpbroadcastd_avx512f();
        auVar16._0_20_ = auVar18._0_20_;
        auVar16._20_4_ = auVar17._20_4_;
        auVar16._24_4_ = auVar18._24_4_;
        auVar16._28_4_ = auVar18._28_4_;
        auVar16._32_4_ = auVar18._32_4_;
        auVar16._36_4_ = auVar18._36_4_;
        auVar16._40_4_ = auVar18._40_4_;
        auVar16._44_4_ = auVar18._44_4_;
        auVar16._48_4_ = auVar18._48_4_;
        auVar16._52_4_ = auVar18._52_4_;
        auVar16._56_4_ = auVar18._56_4_;
        auVar16._60_4_ = auVar18._60_4_;
      }
      auVar17 = auVar16;
      if ((uVar4 & 0x40) != 0) {
        auVar18 = vpbroadcastd_avx512f();
        auVar17._0_24_ = auVar16._0_24_;
        auVar17._24_4_ = auVar18._24_4_;
        auVar17._28_4_ = auVar16._28_4_;
        auVar17._32_4_ = auVar16._32_4_;
        auVar17._36_4_ = auVar16._36_4_;
        auVar17._40_4_ = auVar16._40_4_;
        auVar17._44_4_ = auVar16._44_4_;
        auVar17._48_4_ = auVar16._48_4_;
        auVar17._52_4_ = auVar16._52_4_;
        auVar17._56_4_ = auVar16._56_4_;
        auVar17._60_4_ = auVar16._60_4_;
      }
      auVar19 = auVar17;
      if ((uVar4 & 0x80) != 0) {
        auVar18 = vpbroadcastd_avx512f();
        auVar19._0_28_ = auVar17._0_28_;
        auVar19._28_4_ = auVar18._28_4_;
        auVar19._32_4_ = auVar17._32_4_;
        auVar19._36_4_ = auVar17._36_4_;
        auVar19._40_4_ = auVar17._40_4_;
        auVar19._44_4_ = auVar17._44_4_;
        auVar19._48_4_ = auVar17._48_4_;
        auVar19._52_4_ = auVar17._52_4_;
        auVar19._56_4_ = auVar17._56_4_;
        auVar19._60_4_ = auVar17._60_4_;
      }
      uVar4 = vpcmpuq_avx512f(auVar8,auVar13,2);
      auVar20 = auVar19;
      if ((uVar4 & 1) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar20._0_32_ = auVar19._0_32_;
        auVar20._32_4_ = auVar18._32_4_;
        auVar20._36_4_ = auVar19._36_4_;
        auVar20._40_4_ = auVar19._40_4_;
        auVar20._44_4_ = auVar19._44_4_;
        auVar20._48_4_ = auVar19._48_4_;
        auVar20._52_4_ = auVar19._52_4_;
        auVar20._56_4_ = auVar19._56_4_;
        auVar20._60_4_ = auVar19._60_4_;
      }
      auVar21 = auVar20;
      if ((uVar4 & 2) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar21._0_36_ = auVar20._0_36_;
        auVar21._36_4_ = auVar18._36_4_;
        auVar21._40_4_ = auVar20._40_4_;
        auVar21._44_4_ = auVar20._44_4_;
        auVar21._48_4_ = auVar20._48_4_;
        auVar21._52_4_ = auVar20._52_4_;
        auVar21._56_4_ = auVar20._56_4_;
        auVar21._60_4_ = auVar20._60_4_;
      }
      auVar22 = auVar21;
      if ((uVar4 & 4) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar22._0_40_ = auVar21._0_40_;
        auVar22._40_4_ = auVar18._40_4_;
        auVar22._44_4_ = auVar21._44_4_;
        auVar22._48_4_ = auVar21._48_4_;
        auVar22._52_4_ = auVar21._52_4_;
        auVar22._56_4_ = auVar21._56_4_;
        auVar22._60_4_ = auVar21._60_4_;
      }
      auVar23 = auVar22;
      if ((uVar4 & 8) != 0) {
        vextracti32x4_avx512f(auVar15,2);
        auVar18 = vpbroadcastd_avx512f();
        auVar23._0_44_ = auVar22._0_44_;
        auVar23._44_4_ = auVar18._44_4_;
        auVar23._48_4_ = auVar22._48_4_;
        auVar23._52_4_ = auVar22._52_4_;
        auVar23._56_4_ = auVar22._56_4_;
        auVar23._60_4_ = auVar22._60_4_;
      }
      auVar24 = auVar23;
      if ((uVar4 & 0x10) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar24._0_48_ = auVar23._0_48_;
        auVar24._48_4_ = auVar18._48_4_;
        auVar24._52_4_ = auVar23._52_4_;
        auVar24._56_4_ = auVar23._56_4_;
        auVar24._60_4_ = auVar23._60_4_;
      }
      auVar25 = auVar24;
      if ((uVar4 & 0x20) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar25._0_52_ = auVar24._0_52_;
        auVar25._52_4_ = auVar18._52_4_;
        auVar25._56_4_ = auVar24._56_4_;
        auVar25._60_4_ = auVar24._60_4_;
      }
      auVar26 = auVar25;
      if ((uVar4 & 0x40) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar18 = vpbroadcastd_avx512f();
        auVar26._0_56_ = auVar25._0_56_;
        auVar26._56_4_ = auVar18._56_4_;
        auVar26._60_4_ = auVar25._60_4_;
      }
      in_ZMM7 = auVar26;
      if ((uVar4 & 0x80) != 0) {
        vextracti32x4_avx512f(auVar15,3);
        auVar15 = vpbroadcastd_avx512f();
        in_ZMM7._60_4_ = auVar15._60_4_;
        in_ZMM7._0_60_ = auVar26._0_60_;
      }
      auVar9 = vpaddq_avx512f(auVar9,auVar11);
      auVar8 = vpaddq_avx512f(auVar8,auVar11);
      auVar10 = vpaddd_avx512f(auVar10,auVar12);
      auVar15 = vmovdqu32_avx512f(in_ZMM7);
      *(undefined1 (*) [64])
       ((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar5) = auVar15;
      lVar5 = lVar5 + 0x40;
    } while ((__n + 0xf >> 4) * 0x40 != lVar5);
  }
  if (uVar1 * heightOut != 0) {
    puVar6 = puVar6 + (ulong)startXOut + (ulong)(startYOut * uVar1);
    iVar3 = 0;
    puVar7 = puVar6 + uVar1 * heightOut;
    do {
      if (widthOut != 0) {
        uVar4 = 0;
        do {
          puVar6[uVar4] =
               local_88[(ulong)local_48.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar4] +
                        (ulong)(((iVar3 * local_74) / heightOut) * local_78) + (ulong)local_7c];
          uVar4 = uVar4 + 1;
        } while (__n != uVar4);
      }
      puVar6 = puVar6 + uVar1;
      iVar3 = iVar3 + 1;
    } while (puVar6 != puVar7);
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + heightOut * rowSizeOut;

        uint32_t idY = 0;

        // Precalculation of X position
        std::vector < uint32_t > positionX( widthOut );
        for( uint32_t x = 0; x < widthOut; ++x )
            positionX[x] = x * widthIn / widthOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++idY ) {
            const uint8_t * inX  = inY + (idY * heightIn / heightOut) * rowSizeIn;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + widthOut;

            const uint32_t * idX = positionX.data();

            for( ; outX != outXEnd; ++outX, ++idX )
                (*outX) = *(inX + (*idX));
        }
    }